

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  FastFieldValuePrinter *pFVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  *puVar6;
  _Rb_tree_header *p_Var7;
  Message *message_00;
  _Base_ptr p_Var8;
  pointer ppMVar9;
  unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  *puVar10;
  char *pcVar11;
  undefined1 auVar12 [8];
  __pthread_internal_list *p_Var13;
  ulong uVar14;
  undefined1 local_f0 [8];
  DynamicMessageFactory factory;
  _func_void_FieldDescriptor_ptr *local_a0;
  FieldDescriptor *local_98;
  _Rb_tree_header *local_90;
  undefined1 auStack_88 [8];
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  sorted_map_field;
  uint local_34;
  
  if ((this->use_short_repeated_primitives_ == true) && (*(int *)(field + 0x3c) == 3)) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_f0 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
      auStack_88 = (undefined1  [8])field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_f0,
                 (FieldDescriptor **)auStack_88);
    }
    iVar5 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
    if (iVar5 != 9) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_f0 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
        auStack_88 = (undefined1  [8])field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_f0,
                   (FieldDescriptor **)auStack_88);
        iVar5 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
      }
      if (iVar5 != 10) {
        PrintShortRepeatedField(this,message,reflection,field,generator);
        return;
      }
    }
  }
  if (*(int *)(field + 0x3c) == 3) {
    local_34 = Reflection::FieldSize(reflection,message,field);
  }
  else {
    bVar4 = Reflection::HasField(reflection,message,field);
    if ((bVar4) ||
       (local_34 = 0, *(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x4b) == '\x01')) {
      local_34 = 1;
    }
  }
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)local_f0);
  auStack_88 = (undefined1  [8])0x0;
  sorted_map_field.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sorted_map_field.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_a0 = FieldDescriptor::TypeOnceInit;
    local_98 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_a0,&local_98);
  }
  if ((*(int *)(field + 0x38) == 0xb) &&
     (bVar4 = FieldDescriptor::is_map_message_type(field), bVar4)) {
    bVar4 = internal::MapFieldPrinterHelper::SortMap
                      (message,reflection,field,(MessageFactory *)local_f0,
                       (vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                        *)auStack_88);
    bVar3 = true;
  }
  else {
    bVar3 = false;
    bVar4 = false;
  }
  if (0 < (int)local_34) {
    local_90 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
    puVar6 = &this->default_field_value_printer_;
    factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)(ulong)local_34;
    p_Var13 = (__pthread_internal_list *)0x0;
    do {
      uVar14 = 0xffffffff;
      if (*(int *)(field + 0x3c) == 3) {
        uVar14 = (ulong)p_Var13 & 0xffffffff;
      }
      PrintFieldName(this,message,(int)uVar14,local_34,reflection,field,generator);
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_a0 = FieldDescriptor::TypeOnceInit;
        local_98 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),&local_a0,&local_98);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
        p_Var8 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = local_90;
        puVar10 = puVar6;
        if (p_Var8 != (_Base_ptr)0x0) {
          do {
            if (*(FieldDescriptor **)(p_Var8 + 1) >= field) {
              p_Var7 = (_Rb_tree_header *)p_Var8;
            }
            p_Var8 = (&p_Var8->_M_left)[*(FieldDescriptor **)(p_Var8 + 1) < field];
          } while (p_Var8 != (_Base_ptr)0x0);
          if ((p_Var7 != local_90) &&
             (puVar10 = (unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                         *)(p_Var7 + 1), field < (FieldDescriptor *)p_Var7->_M_node_count)) {
            puVar10 = puVar6;
          }
        }
        pFVar1 = (puVar10->_M_t).
                 super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                 .
                 super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>
                 ._M_head_impl;
        if (*(int *)(field + 0x3c) == 3) {
          if (bVar3) {
            message_00 = *(Message **)((long)auStack_88 + (long)p_Var13 * 8);
          }
          else {
            message_00 = Reflection::GetRepeatedMessage(reflection,message,field,(int)p_Var13);
          }
        }
        else {
          message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
        }
        (*pFVar1->_vptr_FastFieldValuePrinter[0xe])
                  (pFVar1,message_00,uVar14,(ulong)local_34,(ulong)this->single_line_mode_,generator
                  );
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])();
        iVar5 = (*pFVar1->_vptr_FastFieldValuePrinter[0xf])
                          (pFVar1,message_00,uVar14,(ulong)local_34,(ulong)this->single_line_mode_,
                           generator);
        if ((char)iVar5 == '\0') {
          Print(this,message_00,generator);
        }
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])();
        (*pFVar1->_vptr_FastFieldValuePrinter[0x10])
                  (pFVar1,message_00,uVar14,(ulong)local_34,(ulong)this->single_line_mode_,generator
                  );
      }
      else {
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": ",2);
        PrintFieldValue(this,message,reflection,field,(int)uVar14,generator);
        pcVar11 = "\n";
        if (this->single_line_mode_ != false) {
          pcVar11 = " ";
        }
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,pcVar11,1);
      }
      p_Var13 = (__pthread_internal_list *)((long)&p_Var13->__prev + 1);
    } while (p_Var13 !=
             factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.__next);
  }
  auVar12 = auStack_88;
  if ((bVar4 != false) &&
     ((undefined1  [8])
      sorted_map_field.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start != auStack_88)) {
    uVar14 = 0;
    ppMVar9 = sorted_map_field.
              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      plVar2 = *(long **)((long)auVar12 + uVar14 * 8);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))(plVar2);
        ppMVar9 = sorted_map_field.
                  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        auVar12 = auStack_88;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)ppMVar9 - (long)auVar12 >> 3));
  }
  if (auVar12 != (undefined1  [8])0x0) {
    operator_delete((void *)auVar12);
  }
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)local_f0);
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator* generator) const {
  if (use_short_repeated_primitives_ && field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field) ||
             field->containing_type()->options().map_entry()) {
    count = 1;
  }

  DynamicMessageFactory factory;
  std::vector<const Message*> sorted_map_field;
  bool need_release = false;
  bool is_map = field->is_map();
  if (is_map) {
    need_release = internal::MapFieldPrinterHelper::SortMap(
        message, reflection, field, &factory, &sorted_map_field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, field_index, count, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FastFieldValuePrinter* printer = GetFieldPrinter(field);
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *sorted_map_field[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      printer->PrintMessageStart(sub_message, field_index, count,
                                 single_line_mode_, generator);
      generator->Indent();
      if (!printer->PrintMessageContent(sub_message, field_index, count,
                                        single_line_mode_, generator)) {
        Print(sub_message, generator);
      }
      generator->Outdent();
      printer->PrintMessageEnd(sub_message, field_index, count,
                               single_line_mode_, generator);
    } else {
      generator->PrintLiteral(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator->PrintLiteral(" ");
      } else {
        generator->PrintLiteral("\n");
      }
    }
  }

  if (need_release) {
    for (int j = 0; j < sorted_map_field.size(); ++j) {
      delete sorted_map_field[j];
    }
  }
}